

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmTargetTraceDependencies::IsUtility(cmTargetTraceDependencies *this,string *dep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  cmGeneratorTarget *this_00;
  char *__s;
  string tLocation;
  string depLocation;
  string util;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&local_70,dep);
  cmsys::SystemTools::GetFilenameLastExtension(&local_b0,&local_70);
  iVar5 = std::__cxx11::string::compare((char *)&local_b0);
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (iVar5 == 0) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_b0,&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse
                      (this->GeneratorTarget->LocalGenerator,&local_70);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    bVar4 = cmsys::SystemTools::FileIsFullPath(dep);
    if (!bVar4) {
      bVar4 = true;
      cmTarget::AddUtility(this->GeneratorTarget->Target,&local_70,(cmMakefile *)0x0);
      goto LAB_00166d4b;
    }
    if (this_00->Target->TargetTypeValue < OBJECT_LIBRARY) {
      __s = cmGeneratorTarget::GetLocationForBuild(this_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,__s,(allocator<char> *)&local_90);
      cmsys::SystemTools::GetFilenamePath(&local_90,&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      paVar2 = &local_90.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::GetFilenamePath(&local_90,dep);
      cmsys::SystemTools::CollapseFullPath(&local_50,&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::CollapseFullPath(&local_50,&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Var3._M_p = local_90._M_dataplus._M_p;
      if ((local_90._M_string_length == local_b0._M_string_length) &&
         ((local_90._M_string_length == 0 ||
          (iVar5 = bcmp(local_90._M_dataplus._M_p,local_b0._M_dataplus._M_p,
                        local_90._M_string_length), iVar5 == 0)))) {
        cmTarget::AddUtility(this->GeneratorTarget->Target,&local_70,(cmMakefile *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
        goto LAB_00166d4b;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != paVar2) {
        operator_delete(_Var3._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar4 = false;
LAB_00166d4b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmTargetTraceDependencies::IsUtility(std::string const& dep)
{
  // Dependencies on targets (utilities) are supposed to be named by
  // just the target name.  However for compatibility we support
  // naming the output file generated by the target (assuming there is
  // no output-name property which old code would not have set).  In
  // that case the target name will be the file basename of the
  // dependency.
  std::string util = cmSystemTools::GetFilenameName(dep);
  if (cmSystemTools::GetFilenameLastExtension(util) == ".exe") {
    util = cmSystemTools::GetFilenameWithoutLastExtension(util);
  }

  // Check for a target with this name.
  if (cmGeneratorTarget* t =
        this->GeneratorTarget->GetLocalGenerator()->FindGeneratorTargetToUse(
          util)) {
    // If we find the target and the dep was given as a full path,
    // then make sure it was not a full path to something else, and
    // the fact that the name matched a target was just a coincidence.
    if (cmSystemTools::FileIsFullPath(dep)) {
      if (t->GetType() >= cmStateEnums::EXECUTABLE &&
          t->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        // This is really only for compatibility so we do not need to
        // worry about configuration names and output names.
        std::string tLocation = t->GetLocationForBuild();
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        std::string depLocation = cmSystemTools::GetFilenamePath(dep);
        depLocation = cmSystemTools::CollapseFullPath(depLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
        if (depLocation == tLocation) {
          this->GeneratorTarget->Target->AddUtility(util);
          return true;
        }
      }
    } else {
      // The original name of the dependency was not a full path.  It
      // must name a target, so add the target-level dependency.
      this->GeneratorTarget->Target->AddUtility(util);
      return true;
    }
  }

  // The dependency does not name a target built in this project.
  return false;
}